

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::CommissionerApp::DisableJoiner
          (Error *__return_storage_ptr__,CommissionerApp *this,JoinerType aType,uint64_t aEui64)

{
  ErrorCode EVar1;
  element_type *peVar2;
  pointer puVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  pointer *__dest;
  char *pcVar6;
  ushort uVar7;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  size_t __n;
  Error *pEVar8;
  vector<unsigned_char,std::allocator<unsigned_char>> *this_00;
  ulong uVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>,_std::_Rb_tree_iterator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
  pVar10;
  format_args args;
  ByteArray local_138;
  string *local_118;
  Error *local_110;
  undefined1 local_108 [8];
  pointer *ppuStack_100;
  pointer local_f8;
  pointer local_f0;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_e8;
  parse_func local_e0 [1];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  undefined1 local_d0 [8];
  pointer local_c8;
  pointer local_b0 [3];
  pointer local_98 [3];
  undefined8 local_80;
  string local_78;
  ErrorCode local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  local_118 = (string *)&__return_storage_ptr__->mMessage;
  local_d8 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_d8;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0._0_2_ = (this->mCommDataset).mBorderAgentLocator;
  local_d0._2_2_ = (this->mCommDataset).mSessionId;
  this_00 = (vector<unsigned_char,std::allocator<unsigned_char>> *)&local_c8;
  local_110 = __return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
             &(this->mCommDataset).mSteeringData);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0,
             &(this->mCommDataset).mAeSteeringData);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,
             &(this->mCommDataset).mNmkpSteeringData);
  uVar9._0_2_ = (this->mCommDataset).mJoinerUdpPort;
  uVar9._2_2_ = (this->mCommDataset).mAeUdpPort;
  uVar9._4_2_ = (this->mCommDataset).mNmkpUdpPort;
  uVar9._6_2_ = (this->mCommDataset).mPresentFlags;
  local_80 = uVar9 & 0x3fffffffffffffff;
  if (aType == kMeshCoP) {
    uVar7 = 0x2000;
  }
  else if (aType == kNMKP) {
    uVar7 = 0x800;
    this_00 = (vector<unsigned_char,std::allocator<unsigned_char>> *)local_98;
  }
  else {
    if (aType != kAE) {
      abort();
    }
    uVar7 = 0x1000;
    this_00 = (vector<unsigned_char,std::allocator<unsigned_char>> *)local_b0;
  }
  local_80._6_2_ = uVar7 | uVar9._6_2_ & 0x3fff;
  iVar4 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])(this);
  pEVar8 = local_110;
  if ((char)iVar4 == '\0') {
    local_108 = (undefined1  [8])((ulong)local_108 & 0xffffffff00000000);
    ppuStack_100 = (pointer *)0x249d58;
    local_f8 = (pointer)0x1e;
    local_f0 = (pointer)0x0;
    local_e0[0] = (parse_func)0x0;
    begin = "the commissioner is not active";
    local_e8 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_108;
    do {
      pcVar6 = begin + 1;
      if (*begin == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_108);
      }
      begin = pcVar6;
    } while (pcVar6 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_108;
    ::fmt::v10::vformat_abi_cxx11_(&local_78,(v10 *)0x249d58,(string_view)ZEXT816(0x1e),args);
    local_58 = kInvalidState;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    pEVar8->mCode = local_58;
    std::__cxx11::string::operator=(local_118,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_001aaa78;
  }
  else {
    local_108 = (undefined1  [8])((ulong)local_108 & 0xffffffffffffff00);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
              (this_00,local_108);
    for (p_Var5 = (this->mJoiners)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(this->mJoiners)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      if ((p_Var5[2]._M_color != aType) || (p_Var5[2]._M_parent != (_Base_ptr)aEui64)) {
        Commissioner::ComputeJoinerId((ByteArray *)local_108,aEui64);
        puVar3 = local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start;
        local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_108;
        local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)ppuStack_100;
        local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_f8;
        local_108 = (undefined1  [8])0x0;
        ppuStack_100 = (pointer *)0x0;
        local_f8 = (pointer)0x0;
        if (((pointer *)puVar3 != (pointer *)0x0) &&
           (operator_delete(puVar3), local_108 != (undefined1  [8])0x0)) {
          operator_delete((void *)local_108);
        }
        Commissioner::AddJoiner((ByteArray *)this_00,&local_138);
      }
    }
    peVar2 = (this->mCommissioner).
             super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_Commissioner[0x14])(local_108,peVar2,local_d0);
    pEVar8 = local_110;
    local_110->mCode = local_108._0_4_;
    std::__cxx11::string::operator=(local_118,(string *)&ppuStack_100);
    EVar1 = pEVar8->mCode;
    if (ppuStack_100 != &local_f0) {
      operator_delete(ppuStack_100);
    }
    if (EVar1 != kNone) goto LAB_001aaa78;
    MergeDataset(&this->mCommDataset,(CommissionerDataset *)local_d0);
    local_108._0_4_ = aType;
    uVar9 = (long)local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (uVar9 == 0) {
      __dest = (pointer *)0x0;
      __n = 0;
    }
    else {
      if ((long)uVar9 < 0) {
        std::__throw_bad_alloc();
      }
      __dest = (pointer *)operator_new(uVar9);
      __n = (long)local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    }
    local_f0 = (pointer)((long)__dest + uVar9);
    ppuStack_100 = __dest;
    if (local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      memmove(__dest,local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,__n);
    }
    local_f8 = (pointer)((long)__dest + __n);
    pVar10 = std::
             _Rb_tree<ot::commissioner::CommissionerApp::JoinerKey,_std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>,_std::_Select1st<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
             ::equal_range(&(this->mJoiners)._M_t,(key_type *)local_108);
    std::
    _Rb_tree<ot::commissioner::CommissionerApp::JoinerKey,_std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>,_std::_Select1st<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
    ::_M_erase_aux(&(this->mJoiners)._M_t,(_Base_ptr)pVar10.first._M_node,
                   (_Base_ptr)pVar10.second._M_node);
    local_78._M_dataplus._M_p = (pointer)ppuStack_100;
    pEVar8 = local_110;
    if (ppuStack_100 == (pointer *)0x0) goto LAB_001aaa78;
  }
  operator_delete(local_78._M_dataplus._M_p);
LAB_001aaa78:
  if (local_98[0] != (pointer)0x0) {
    operator_delete(local_98[0]);
  }
  if (local_b0[0] != (pointer)0x0) {
    operator_delete(local_b0[0]);
  }
  if (local_c8 != (pointer)0x0) {
    operator_delete(local_c8);
  }
  if ((pointer *)
      local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return pEVar8;
}

Assistant:

Error CommissionerApp::DisableJoiner(JoinerType aType, uint64_t aEui64)
{
    Error     error;
    ByteArray joinerId;
    auto      commDataset = mCommDataset;
    commDataset.mPresentFlags &= ~CommissionerDataset::kSessionIdBit;
    commDataset.mPresentFlags &= ~CommissionerDataset::kBorderAgentLocatorBit;
    auto &steeringData = GetSteeringData(commDataset, aType);

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    steeringData = {0x00};
    for (const auto &kv : mJoiners)
    {
        auto &joiner = kv.second;
        if (joiner.mType == aType && joiner.mEui64 == aEui64)
        {
            continue;
        }
        joinerId = Commissioner::ComputeJoinerId(aEui64);
        Commissioner::AddJoiner(steeringData, joinerId);
    }

    SuccessOrExit(error = mCommissioner->SetCommissionerDataset(commDataset));

    MergeDataset(mCommDataset, commDataset);
    mJoiners.erase(JoinerKey{aType, joinerId});

exit:
    return error;
}